

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

void __thiscall
slang::syntax::UdpInitialStmtSyntax::setChild
          (UdpInitialStmtSyntax *this,size_t index,TokenOrSyntax child)

{
  long in_RSI;
  
  (*(code *)(&DAT_00ab06d4 + *(int *)(&DAT_00ab06d4 + in_RSI * 4)))();
  return;
}

Assistant:

void UdpInitialStmtSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: initial = child.token(); return;
        case 1: name = child.token(); return;
        case 2: equals = child.token(); return;
        case 3: value = child.node() ? &child.node()->as<ExpressionSyntax>() : nullptr; return;
        case 4: semi = child.token(); return;
        default: SLANG_UNREACHABLE;
    }
}